

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

uint32_t pm_read_bytes(PmInternal *midi,uchar *data,int len,PmTimestamp timestamp)

{
  uint32_t uVar1;
  byte bVar2;
  uchar *puVar3;
  int iVar4;
  PmError PVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint32_t uVar9;
  ulong uVar10;
  long lVar11;
  PmEvent event;
  uint32_t local_58;
  PmEvent local_54;
  int local_4c;
  uchar *local_48;
  ulong local_40;
  long local_38;
  
  local_54.timestamp = timestamp;
  local_48 = data;
  if (midi == (PmInternal *)0x0) {
    __assert_fail("midi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x425,
                  "uint32_t pm_read_bytes(PmInternal *, const unsigned char *, int, PmTimestamp)");
  }
  uVar10 = (ulong)(uint)len;
  if (len == 0) {
    uVar9 = 0;
  }
  else {
    if (midi->sysex_in_progress == 0) {
      uVar9 = 0;
      do {
        if (len <= (int)uVar9) goto LAB_00103e6a;
        uVar1 = uVar9 + 1;
        bVar2 = local_48[(int)uVar9];
        if (bVar2 == 0xf7) {
LAB_00104014:
          midi->sysex_in_progress = 0;
          iVar7 = 1;
          uVar9 = uVar1;
          local_58 = uVar1;
        }
        else {
          if (bVar2 == 0xf0) {
            if ((midi->filters & 1) == 0) {
              midi->sysex_in_progress = 1;
              iVar7 = 3;
              goto LAB_00104041;
            }
            if (bVar2 == 0xf7) goto LAB_00104014;
          }
          iVar7 = 0;
          uVar9 = uVar1;
          if ((char)bVar2 < '\0') {
            local_54.message = (uint)bVar2;
            pm_read_short(midi,&local_54);
          }
        }
LAB_00104041:
      } while (iVar7 == 0);
      if (iVar7 != 3) {
        return local_58;
      }
    }
    else {
      uVar9 = 0;
    }
LAB_00103e6a:
    if ((int)uVar9 < len) {
      iVar7 = len + -4;
      local_38 = (long)len;
      local_4c = iVar7;
      local_40 = uVar10;
      while (puVar3 = local_48, midi->sysex_in_progress != 0) {
        if (((midi->sysex_message_count == 0) && ((int)uVar9 <= iVar7)) &&
           (local_54.message = *(PmMessage *)(local_48 + (int)uVar9),
           (local_54.message & 0x80808080U) == 0)) {
          PVar5 = Pm_Enqueue(midi->queue,&local_54);
          if (PVar5 == pmBufferOverflow) {
            midi->sysex_in_progress = 0;
          }
          uVar9 = uVar9 + 4;
        }
        else if ((int)uVar9 < (int)uVar10) {
          lVar8 = local_38 - (int)uVar9;
          lVar11 = 0;
          do {
            uVar6 = (uint)puVar3[lVar11 + (int)uVar9];
            if (((~uVar6 & 0xf8) != 0) ||
               (iVar4 = 6, ((uint)midi->filters >> (puVar3[lVar11 + (int)uVar9] & 0xf) & 1) == 0)) {
              iVar4 = midi->sysex_message_count;
              iVar7 = iVar4 + 1;
              midi->sysex_message_count = iVar7;
              bVar2 = (byte)(iVar4 << 3) & 0x1f;
              midi->sysex_message = midi->sysex_message | uVar6 << bVar2;
              if (uVar6 == 0xf7) {
                midi->sysex_in_progress = 0;
                pm_flush_sysex(midi,local_54.timestamp);
                local_58 = (int)lVar11 + uVar9 + 1;
                iVar4 = 1;
              }
              else {
                iVar4 = 0 << bVar2;
                if (iVar7 == 4) {
                  pm_flush_sysex(midi,local_54.timestamp);
                  iVar4 = 7;
                }
              }
            }
            uVar10 = local_40;
            iVar7 = local_4c;
            if ((iVar4 != 0) && (iVar4 != 6)) {
              if (iVar4 != 7) {
                return local_58;
              }
              uVar9 = uVar9 + (int)lVar11 + 1;
              goto LAB_00103fb1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar8 != lVar11);
          uVar9 = (uint32_t)local_40;
        }
LAB_00103fb1:
        if ((int)uVar10 <= (int)uVar9) {
          return uVar9;
        }
      }
    }
  }
  return uVar9;
}

Assistant:

unsigned int pm_read_bytes(PmInternal *midi, const unsigned char *data, 
                    int len, PmTimestamp timestamp)
{
    int i = 0; /* index into data, must not be unsigned (!) */
    PmEvent event;
    event.timestamp = timestamp;
    assert(midi);
    /* note that since buffers may not have multiples of 4 bytes,
     * pm_read_bytes may be called in the middle of an outgoing
     * 4-byte PortMidi message. sysex_in_progress indicates that
     * a sysex has been sent but no eox.
     */
    if (len == 0) return 0; /* sanity check */
    if (!midi->sysex_in_progress) {
        while (i < len) { /* process all data */
            unsigned char byte = data[i++];
            if (byte == MIDI_SYSEX &&
                !pm_realtime_filtered(byte, midi->filters)) {
                midi->sysex_in_progress = TRUE;
                i--; /* back up so code below will get SYSEX byte */
                break; /* continue looping below to process msg */
            } else if (byte == MIDI_EOX) {
                midi->sysex_in_progress = FALSE;
                return i; /* done with one message */
            } else if (byte & MIDI_STATUS_MASK) {
                /* We're getting MIDI but no sysex in progress.
                 * Either the SYSEX status byte was dropped or
                 * the message was filtered. Drop the data, but
                 * send any embedded realtime bytes.
                 */
                /* assume that this is a real-time message:
                 * it is an error to pass non-real-time messages
                 * to pm_read_bytes
                 */
                event.message = byte;
                pm_read_short(midi, &event);
            }
        } /* all bytes in the buffer are processed */
    }
    /* Now, i<len implies sysex_in_progress. If sysex_in_progress
     * becomes false in the loop, there must have been an overflow
     * and we can just drop all remaining bytes 
     */
    while (i < len && midi->sysex_in_progress) {
        if (midi->sysex_message_count == 0 && i <= len - 4 &&
            ((event.message = (((PmMessage) data[i]) | 
                             (((PmMessage) data[i+1]) << 8) |
                             (((PmMessage) data[i+2]) << 16) |
                             (((PmMessage) data[i+3]) << 24))) &
             0x80808080) == 0) { /* all data, no status */ 
            if (Pm_Enqueue(midi->queue, &event) == pmBufferOverflow) {
                midi->sysex_in_progress = FALSE;
            }
            i += 4;
        } else {
            while (i < len) {
                /* send one byte at a time */
                unsigned char byte = data[i++];
                if (is_real_time(byte) && 
                    pm_realtime_filtered(byte, midi->filters)) {
                    continue; /* real-time data is filtered, so omit */
                }
                midi->sysex_message |= 
                    (byte << (8 * midi->sysex_message_count++));
                if (byte == MIDI_EOX) {
                    midi->sysex_in_progress = FALSE;
                    pm_flush_sysex(midi, event.timestamp);
                    return i;
                } else if (midi->sysex_message_count == 4) {
                    pm_flush_sysex(midi, event.timestamp);
                    /* after handling at least one non-data byte
                     * and reaching a 4-byte message boundary,
                     * resume trying to send 4 at a time in outer loop
                     */
                    break;
                }
            }
        }
    }
    return i;
}